

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

int av1_get_palette_delta_bits_v(PALETTE_MODE_INFO *pmi,int bit_depth,int *zero_count,int *min_bits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  
  bVar1 = pmi->palette_size[1];
  *min_bits = bit_depth + -4;
  *zero_count = 0;
  iVar9 = 0;
  if (1 < (ulong)bVar1) {
    uVar2 = pmi->palette_colors[0x10];
    lVar8 = 0;
    iVar9 = 0;
    uVar5 = 0;
    do {
      uVar7 = (uint)uVar2;
      uVar2 = pmi->palette_colors[lVar8 + 0x11];
      uVar3 = (ushort)(uVar2 - uVar7);
      uVar6 = -uVar3;
      if (0 < (int)(uVar2 - uVar7)) {
        uVar6 = uVar3;
      }
      uVar7 = (1 << ((byte)bit_depth & 0x1f)) - (uint)uVar6;
      if ((int)(uint)uVar6 < (int)uVar7) {
        uVar7 = (uint)uVar6;
      }
      if ((int)uVar5 < (int)uVar7) {
        uVar5 = uVar7;
      }
      if (uVar7 == 0) {
        iVar9 = iVar9 + 1;
        *zero_count = iVar9;
      }
      lVar8 = lVar8 + 1;
    } while ((ulong)bVar1 - 1 != lVar8);
    uVar7 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    iVar9 = 0;
    if (0 < (int)uVar5) {
      iVar9 = (uVar7 ^ 0xffffffe0) + 0x21;
    }
  }
  iVar4 = *min_bits;
  if (*min_bits < iVar9) {
    iVar4 = iVar9;
  }
  return iVar4;
}

Assistant:

int av1_get_palette_delta_bits_v(const PALETTE_MODE_INFO *const pmi,
                                 int bit_depth, int *zero_count,
                                 int *min_bits) {
  const int n = pmi->palette_size[1];
  const int max_val = 1 << bit_depth;
  int max_d = 0;
  *min_bits = bit_depth - 4;
  *zero_count = 0;
  for (int i = 1; i < n; ++i) {
    const int delta = pmi->palette_colors[2 * PALETTE_MAX_SIZE + i] -
                      pmi->palette_colors[2 * PALETTE_MAX_SIZE + i - 1];
    const int v = abs(delta);
    const int d = AOMMIN(v, max_val - v);
    if (d > max_d) max_d = d;
    if (d == 0) ++(*zero_count);
  }
  return AOMMAX(av1_ceil_log2(max_d + 1), *min_bits);
}